

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_zTXt(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  png_uint_32 pVar1;
  int iVar2;
  png_bytep buf;
  bool bVar3;
  undefined1 local_78 [8];
  png_text text;
  png_alloc_size_t uncompressed_length;
  png_uint_32 keyword_length;
  png_bytep buffer;
  png_const_charp errmsg;
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  buffer = (png_bytep)0x0;
  if (png_ptr->user_chunk_cache_max != 0) {
    if (png_ptr->user_chunk_cache_max == 1) {
      png_crc_finish(png_ptr,length);
      return;
    }
    pVar1 = png_ptr->user_chunk_cache_max - 1;
    png_ptr->user_chunk_cache_max = pVar1;
    if (pVar1 == 1) {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"no space in chunk cache");
      return;
    }
  }
  if ((png_ptr->mode & 1) != 0) {
    if ((png_ptr->mode & 4) != 0) {
      png_ptr->mode = png_ptr->mode | 8;
    }
    buf = png_read_buffer(png_ptr,(ulong)length,2);
    if (buf == (png_bytep)0x0) {
      png_crc_finish(png_ptr,length);
      png_chunk_benign_error(png_ptr,"out of memory");
    }
    else {
      png_crc_read(png_ptr,buf,length);
      iVar2 = png_crc_finish(png_ptr,0);
      if (iVar2 == 0) {
        uncompressed_length._4_4_ = 0;
        while( true ) {
          bVar3 = false;
          if (uncompressed_length._4_4_ < length) {
            bVar3 = buf[uncompressed_length._4_4_] != '\0';
          }
          if (!bVar3) break;
          uncompressed_length._4_4_ = uncompressed_length._4_4_ + 1;
        }
        if ((uncompressed_length._4_4_ < 0x50) && (uncompressed_length._4_4_ != 0)) {
          if (length < uncompressed_length._4_4_ + 3) {
            buffer = "truncated";
          }
          else if (buf[uncompressed_length._4_4_ + 1] == '\0') {
            text.lang_key = (png_charp)0xffffffffffffffff;
            iVar2 = png_decompress_chunk
                              (png_ptr,length,uncompressed_length._4_4_ + 2,
                               (png_alloc_size_t *)&text.lang_key,1);
            if (iVar2 == 1) {
              if (png_ptr->read_buffer == (png_bytep)0x0) {
                buffer = "Read failure in png_handle_zTXt";
              }
              else {
                text._0_8_ = png_ptr->read_buffer;
                *(png_byte *)(text._0_8_ + (long)(text.lang_key + (uncompressed_length._4_4_ + 2)))
                     = '\0';
                local_78._0_4_ = 0;
                text.key = (png_charp)(text._0_8_ + (ulong)uncompressed_length._4_4_ + 2);
                text.text = text.lang_key;
                text.text_length = 0;
                text.itxt_length = 0;
                text.lang = (png_charp)0x0;
                iVar2 = png_set_text_2(png_ptr,info_ptr,(png_const_textp)local_78,1);
                if (iVar2 != 0) {
                  buffer = "insufficient memory";
                }
              }
            }
            else {
              buffer = (png_bytep)(png_ptr->zstream).msg;
            }
          }
          else {
            buffer = "unknown compression type";
          }
        }
        else {
          buffer = "bad keyword";
        }
        if (buffer != (png_bytep)0x0) {
          png_chunk_benign_error(png_ptr,(png_const_charp)buffer);
        }
      }
    }
    return;
  }
  png_chunk_error(png_ptr,"missing IHDR");
}

Assistant:

void /* PRIVATE */
png_handle_zTXt(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_const_charp errmsg = NULL;
   png_bytep       buffer;
   png_uint_32     keyword_length;

   png_debug(1, "in png_handle_zTXt");

#ifdef PNG_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_cache_max != 0)
   {
      if (png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         return;
      }

      if (--png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "no space in chunk cache");
         return;
      }
   }
#endif

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
      png_ptr->mode |= PNG_AFTER_IDAT;

   /* Note, "length" is sufficient here; we won't be adding
    * a null terminator later.
    */
   buffer = png_read_buffer(png_ptr, length, 2/*silent*/);

   if (buffer == NULL)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   png_crc_read(png_ptr, buffer, length);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   /* TODO: also check that the keyword contents match the spec! */
   for (keyword_length = 0;
      keyword_length < length && buffer[keyword_length] != 0;
      ++keyword_length)
      /* Empty loop to find end of name */ ;

   if (keyword_length > 79 || keyword_length < 1)
      errmsg = "bad keyword";

   /* zTXt must have some LZ data after the keyword, although it may expand to
    * zero bytes; we need a '\0' at the end of the keyword, the compression type
    * then the LZ data:
    */
   else if (keyword_length + 3 > length)
      errmsg = "truncated";

   else if (buffer[keyword_length+1] != PNG_COMPRESSION_TYPE_BASE)
      errmsg = "unknown compression type";

   else
   {
      png_alloc_size_t uncompressed_length = PNG_SIZE_MAX;

      /* TODO: at present png_decompress_chunk imposes a single application
       * level memory limit, this should be split to different values for iCCP
       * and text chunks.
       */
      if (png_decompress_chunk(png_ptr, length, keyword_length+2,
          &uncompressed_length, 1/*terminate*/) == Z_STREAM_END)
      {
         png_text text;

         if (png_ptr->read_buffer == NULL)
           errmsg="Read failure in png_handle_zTXt";
         else
         {
            /* It worked; png_ptr->read_buffer now looks like a tEXt chunk
             * except for the extra compression type byte and the fact that
             * it isn't necessarily '\0' terminated.
             */
            buffer = png_ptr->read_buffer;
            buffer[uncompressed_length+(keyword_length+2)] = 0;

            text.compression = PNG_TEXT_COMPRESSION_zTXt;
            text.key = (png_charp)buffer;
            text.text = (png_charp)(buffer + keyword_length+2);
            text.text_length = uncompressed_length;
            text.itxt_length = 0;
            text.lang = NULL;
            text.lang_key = NULL;

            if (png_set_text_2(png_ptr, info_ptr, &text, 1) != 0)
               errmsg = "insufficient memory";
         }
      }

      else
         errmsg = png_ptr->zstream.msg;
   }

   if (errmsg != NULL)
      png_chunk_benign_error(png_ptr, errmsg);
}